

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::ReconstructTileOffsets
               (OffsetData *offset_data,EXRHeader *exr_header,uchar *head,uchar *marker,
               size_t param_5,bool isMultiPartFile,bool isDeep)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  ulong uVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  int *in_RCX;
  OffsetData *in_RDX;
  EXRHeader *in_RSI;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *in_RDI;
  byte in_R9B;
  byte in_stack_00000008;
  int level_idx;
  int dataSize;
  tinyexr_int64 packed_sample_size;
  tinyexr_int64 packed_offset_table_size;
  int levelY;
  int levelX;
  int tileY;
  int tileX;
  tinyexr_uint64 tileOffset;
  uint dx;
  uint dy;
  uint l;
  int numXLevels;
  int local_6c;
  tinyexr_uint64 local_68;
  tinyexr_uint64 local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  value_type local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  int local_30;
  byte local_2a;
  byte local_29;
  tinyexr_uint64 *local_20;
  OffsetData *local_18;
  EXRHeader *local_10;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *local_8;
  
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  local_30 = *(int *)&in_RDI[1].
                      super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  local_34 = 0;
  local_20 = (tinyexr_uint64 *)in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    uVar4 = (ulong)local_34;
    sVar5 = std::
            vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::size(local_8);
    if (sVar5 <= uVar4) {
      return;
    }
    local_38 = 0;
    while( true ) {
      uVar6 = (ulong)local_38;
      pvVar7 = std::
               vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ::operator[](local_8,(ulong)local_34);
      sVar5 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::size(pvVar7);
      if (sVar5 <= uVar6) break;
      local_3c = 0;
      while( true ) {
        uVar6 = (ulong)local_3c;
        pvVar7 = std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::operator[](local_8,(ulong)local_34);
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pvVar7,(ulong)local_38);
        sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar8);
        if (sVar5 <= uVar6) break;
        local_48 = (long)local_20 - (long)local_18;
        if ((local_29 & 1) != 0) {
          local_20 = (tinyexr_uint64 *)((long)local_20 + 4);
        }
        local_4c = (int)*local_20;
        swap4(&local_4c);
        local_20 = (tinyexr_uint64 *)((long)local_20 + 4);
        local_50 = *(int *)local_20;
        swap4(&local_50);
        local_20 = (tinyexr_uint64 *)((long)local_20 + 4);
        local_54 = *(int *)local_20;
        swap4(&local_54);
        local_20 = (tinyexr_uint64 *)((long)local_20 + 4);
        local_58 = *(int *)local_20;
        swap4(&local_58);
        local_20 = (tinyexr_uint64 *)((long)local_20 + 4);
        if ((local_2a & 1) == 0) {
          local_6c = (int)*local_20;
          swap4(&local_6c);
          local_20 = (tinyexr_uint64 *)((long)local_20 + (long)local_6c + 4);
        }
        else {
          local_60 = *local_20;
          swap8(&local_60);
          local_20 = local_20 + 1;
          local_68 = *local_20;
          swap8(&local_68);
          local_20 = (tinyexr_uint64 *)((long)local_20 + local_60 + local_68 + 0x10);
        }
        bVar2 = isValidTile(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                            (int)(uVar4 >> 0x20),(int)uVar4);
        if (!bVar2) {
          return;
        }
        iVar3 = LevelIndex(local_54,local_58,local_10->tile_level_mode,local_30);
        vVar1 = local_48;
        pvVar7 = std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::operator[](local_8,(long)iVar3);
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pvVar7,(long)local_50);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar8,(long)local_4c);
        *pvVar9 = vVar1;
        local_3c = local_3c + 1;
      }
      local_38 = local_38 + 1;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

static void ReconstructTileOffsets(OffsetData& offset_data,
                                   const EXRHeader* exr_header,
                                   const unsigned char* head, const unsigned char* marker, const size_t /*size*/,
                                   bool isMultiPartFile,
                                   bool isDeep) {
  int numXLevels = offset_data.num_x_levels;
  for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
    for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
      for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
        tinyexr::tinyexr_uint64 tileOffset = tinyexr::tinyexr_uint64(marker - head);

        if (isMultiPartFile) {
          //int partNumber;
          marker += sizeof(int);
        }

        int tileX;
        memcpy(&tileX, marker, sizeof(int));
        tinyexr::swap4(&tileX);
        marker += sizeof(int);

        int tileY;
        memcpy(&tileY, marker, sizeof(int));
        tinyexr::swap4(&tileY);
        marker += sizeof(int);

        int levelX;
        memcpy(&levelX, marker, sizeof(int));
        tinyexr::swap4(&levelX);
        marker += sizeof(int);

        int levelY;
        memcpy(&levelY, marker, sizeof(int));
        tinyexr::swap4(&levelY);
        marker += sizeof(int);

        if (isDeep) {
          tinyexr::tinyexr_int64 packed_offset_table_size;
          memcpy(&packed_offset_table_size, marker, sizeof(tinyexr::tinyexr_int64));
          tinyexr::swap8(reinterpret_cast<tinyexr::tinyexr_uint64*>(&packed_offset_table_size));
          marker += sizeof(tinyexr::tinyexr_int64);

          tinyexr::tinyexr_int64 packed_sample_size;
          memcpy(&packed_sample_size, marker, sizeof(tinyexr::tinyexr_int64));
          tinyexr::swap8(reinterpret_cast<tinyexr::tinyexr_uint64*>(&packed_sample_size));
          marker += sizeof(tinyexr::tinyexr_int64);

          // next Int64 is unpacked sample size - skip that too
          marker += packed_offset_table_size + packed_sample_size + 8;

        } else {

          int dataSize;
          memcpy(&dataSize, marker, sizeof(int));
          tinyexr::swap4(&dataSize);
          marker += sizeof(int);
          marker += dataSize;
        }

        if (!isValidTile(exr_header, offset_data,
          tileX, tileY, levelX, levelY))
          return;

        int level_idx = LevelIndex(levelX, levelY, exr_header->tile_level_mode, numXLevels);
        offset_data.offsets[size_t(level_idx)][size_t(tileY)][size_t(tileX)] = tileOffset;
      }
    }
  }
}